

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list.hpp
# Opt level: O0

void __thiscall
pstore::broker::intrusive_list<(anonymous_namespace)::value>::insert_before
          (intrusive_list<(anonymous_namespace)::value> *this,value *element,value *before)

{
  list_member<(anonymous_namespace)::value> *plVar1;
  list_member<(anonymous_namespace)::value> *plVar2;
  list_member<(anonymous_namespace)::value> *plVar3;
  list_member<(anonymous_namespace)::value> *before_member;
  list_member<(anonymous_namespace)::value> *element_member;
  value *before_local;
  value *element_local;
  intrusive_list<(anonymous_namespace)::value> *this_local;
  
  plVar1 = anon_unknown.dwarf_647ac::value::get_list_member(element);
  plVar2 = anon_unknown.dwarf_647ac::value::get_list_member(before);
  plVar1->prev = plVar2->prev;
  plVar3 = anon_unknown.dwarf_647ac::value::get_list_member(plVar2->prev);
  plVar3->next = element;
  plVar2->prev = element;
  plVar1->next = before;
  plVar2 = anon_unknown.dwarf_647ac::value::get_list_member(plVar1->next);
  if (plVar2->prev != element) {
    assert_failed("element_member.next->get_list_member ().prev == element",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/intrusive_list.hpp"
                  ,0x89);
  }
  plVar1 = anon_unknown.dwarf_647ac::value::get_list_member(plVar1->prev);
  if (plVar1->next == element) {
    check(this);
    return;
  }
  assert_failed("element_member.prev->get_list_member ().next == element",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/intrusive_list.hpp"
                ,0x8a);
}

Assistant:

void intrusive_list<T>::insert_before (T * element, T * before) noexcept {
            auto & element_member = element->get_list_member ();
            auto & before_member = before->get_list_member ();

            element_member.prev = before_member.prev;
            before_member.prev->get_list_member ().next = element;
            before_member.prev = element;
            element_member.next = before;

            PSTORE_ASSERT (element_member.next->get_list_member ().prev == element);
            PSTORE_ASSERT (element_member.prev->get_list_member ().next == element);
            this->check ();
        }